

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

Value * __thiscall Json::Value::append(Value *this,Value *value)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ArrayIndex index;
  ValueHolder *pVVar6;
  ValueHolder local_30;
  ushort local_28;
  ValueHolder local_20;
  ValueHolder local_18;
  ValueHolder VStack_10;
  
  Value((Value *)&local_30,value);
  index = size(this);
  pVVar6 = &operator[](this,index)->value_;
  uVar1 = *(ushort *)(pVVar6 + 1);
  VVar2 = *pVVar6;
  *pVVar6 = local_30;
  *(ushort *)(pVVar6 + 1) = local_28 & 0x1ff | uVar1 & 0xfe00;
  local_28 = uVar1 & 0x1ff | local_28 & 0xfe00;
  VVar3 = pVVar6[2];
  pVVar6[2] = local_20;
  VVar4 = pVVar6[3];
  VVar5 = pVVar6[4];
  pVVar6[3] = local_18;
  pVVar6[4] = VStack_10;
  local_30 = VVar2;
  local_20 = VVar3;
  local_18 = VVar4;
  VStack_10 = VVar5;
  ~Value((Value *)&local_30);
  return (Value *)pVVar6;
}

Assistant:

Value& Value::append(const Value& value) { return (*this)[size()] = value; }